

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.h
# Opt level: O3

void __thiscall Simulator::read_int(Simulator *this,PCode *code)

{
  Symbol *pSVar1;
  int input;
  int local_1c;
  
  local_1c = 0;
  std::istream::operator>>((istream *)&std::cin,&local_1c);
  pSVar1 = ScopeTree::resolve(&this->tree_,&code->first_);
  (pSVar1->value_).int_value = local_1c;
  pSVar1->is_assigned_ = true;
  this->eip_ = this->eip_ + 1;
  return;
}

Assistant:

void Simulator::read_int(const PCode &code) {
    int input = 0;
    std::cin >> input;
    Symbol &symbol = tree_.resolve(code.first());
    symbol.set_value(input);
    symbol.set_assigned();

    inc_eip();
}